

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rtreeCheckAppendMsg(RtreeCheck *pCheck,char *zFmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *pcVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  char *local_40;
  char *z;
  va_list ap;
  char *zFmt_local;
  RtreeCheck *pCheck_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_f8;
  ap[0]._0_8_ = &stack0x00000008;
  z._4_4_ = 0x30;
  z._0_4_ = 0x10;
  if ((pCheck->rc == 0) && (pCheck->nErr < 100)) {
    local_e8 = in_RDX;
    local_e0 = in_RCX;
    local_d8 = in_R8;
    local_d0 = in_R9;
    local_40 = sqlite3_vmprintf(zFmt,(__va_list_tag *)&z);
    if (local_40 == (char *)0x0) {
      pCheck->rc = 7;
    }
    else {
      pcVar1 = "";
      if (pCheck->zReport != (char *)0x0) {
        pcVar1 = "\n";
      }
      pcVar1 = sqlite3_mprintf("%z%s%z",pCheck->zReport,pcVar1,local_40);
      pCheck->zReport = pcVar1;
      if (pCheck->zReport == (char *)0x0) {
        pCheck->rc = 7;
      }
    }
    pCheck->nErr = pCheck->nErr + 1;
  }
  return;
}

Assistant:

static void rtreeCheckAppendMsg(RtreeCheck *pCheck, const char *zFmt, ...){
  va_list ap;
  va_start(ap, zFmt);
  if( pCheck->rc==SQLITE_OK && pCheck->nErr<RTREE_CHECK_MAX_ERROR ){
    char *z = sqlite3_vmprintf(zFmt, ap);
    if( z==0 ){
      pCheck->rc = SQLITE_NOMEM;
    }else{
      pCheck->zReport = sqlite3_mprintf("%z%s%z", 
          pCheck->zReport, (pCheck->zReport ? "\n" : ""), z
      );
      if( pCheck->zReport==0 ){
        pCheck->rc = SQLITE_NOMEM;
      }
    }
    pCheck->nErr++;
  }
  va_end(ap);
}